

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall CLI::App::get_subcommand(App *this,App *subcom)

{
  bool bVar1;
  undefined8 uVar2;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  string *psVar4;
  element_type *in_RSI;
  long in_RDI;
  App_p *subcomptr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  *in_stack_ffffffffffffff50;
  string local_88 [16];
  string *in_stack_ffffffffffffff88;
  OptionNotFound *in_stack_ffffffffffffff90;
  __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_58;
  long local_50;
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  element_type *local_10;
  
  if (in_RSI == (element_type *)0x0) {
    local_45 = 1;
    uVar2 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_30,"nullptr passed",&local_31);
    OptionNotFound::OptionNotFound(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_45 = 0;
    __cxa_throw(uVar2,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
  }
  local_50 = in_RDI + 0x2c0;
  local_10 = in_RSI;
  local_58._M_current =
       (shared_ptr<CLI::App> *)
       std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                 (in_stack_ffffffffffffff48);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
            (in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x38);
      psVar4 = get_name_abi_cxx11_(local_10);
      ::std::__cxx11::string::string(local_88,(string *)psVar4);
      OptionNotFound::OptionNotFound(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      __cxa_throw(uVar2,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
    }
    this_00 = &__gnu_cxx::
               __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
               ::operator*(&local_58)->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
    peVar3 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    if (peVar3 == local_10) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&local_58);
  }
  peVar3 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
  return peVar3;
}

Assistant:

CLI11_INLINE App *App::get_subcommand(const App *subcom) const {
    if(subcom == nullptr)
        throw OptionNotFound("nullptr passed");
    for(const App_p &subcomptr : subcommands_)
        if(subcomptr.get() == subcom)
            return subcomptr.get();
    throw OptionNotFound(subcom->get_name());
}